

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O2

size_t __thiscall czh::file::StreamFile::get_arrowpos(StreamFile *this,size_t pos)

{
  basic_ifstream<char,_std::char_traits<char>_> *pbVar1;
  istream *piVar2;
  size_t sVar3;
  long lVar4;
  string tmp;
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  local_48 = local_38;
  local_40 = 0;
  local_38[0] = 0;
  pbVar1 = (this->file)._M_t.
           super___uniq_ptr_impl<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
           .super__Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false>.
           _M_head_impl;
  std::ios::clear((int)pbVar1 + (int)*(undefined8 *)(*(long *)pbVar1 + -0x18));
  std::istream::seekg((this->file)._M_t.
                      super___uniq_ptr_impl<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false>
                      ._M_head_impl,0,0);
  sVar3 = 0;
  lVar4 = 0;
  do {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)
                        (this->file)._M_t.
                        super___uniq_ptr_impl<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false>
                        ._M_head_impl,(string *)&local_48);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) {
LAB_0011609d:
      std::__cxx11::string::~string((string *)&local_48);
      return sVar3;
    }
    if (pos <= (ulong)(local_40 + lVar4)) {
      sVar3 = (pos - lVar4) + 1;
      goto LAB_0011609d;
    }
    lVar4 = lVar4 + local_40 + 1;
  } while( true );
}

Assistant:

[[nodiscard]] std::size_t get_arrowpos(std::size_t pos) const override
    {
      std::size_t postmp = 0;
      std::string tmp;
      file->clear();
      file->seekg(std::ios::beg);
      while (std::getline(*file, tmp))
      {
        if (postmp + tmp.size() >= pos) return pos - postmp + 1;
        postmp += tmp.size() + 1;
      }
      return 0;
    }